

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_stat_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,int stat_type,
              LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  undefined4 uVar2;
  int iVar3;
  uint32_t uVar4;
  ssize_t sVar5;
  ulong uVar6;
  char *errmsg;
  int iVar7;
  ulong buflen;
  size_t in_stack_ffffffffffffff88;
  char *local_70;
  uchar *s;
  LIBSSH2_SFTP_ATTRIBUTES *local_60;
  size_t data_len;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  char *local_40;
  time_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_60 = attrs;
    local_40 = path;
    local_38 = time((time_t *)0x0);
    local_50 = path_len + 0xd;
    uVar2 = 0x11;
    if (stat_type == 1) {
      uVar2 = 7;
    }
    local_4c = 9;
    if (stat_type != 2) {
      local_4c = uVar2;
    }
    local_48 = (ulong)path_len;
    iVar7 = local_50;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      data_len = 0;
      iVar3 = 0;
      if (stat_type == 2) {
        iVar3 = sftp_attrsize(local_60->flags);
      }
      local_70 = (char *)0x0;
      buflen = (ulong)(uint)(iVar3 + iVar7);
      if (sftp->stat_state == libssh2_NB_state_created) {
LAB_00125efa:
        uVar6 = _libssh2_channel_write(channel,0,sftp->stat_packet,buflen);
        if (uVar6 != 0xffffffffffffffdb) {
          (*pLVar1->free)(sftp->stat_packet,&pLVar1->abstract);
          sftp->stat_packet = (uchar *)0x0;
          if (uVar6 == buflen) {
            sftp->stat_state = libssh2_NB_state_sent;
            goto LAB_00125f41;
          }
          sftp->stat_state = libssh2_NB_state_idle;
          iVar3 = -7;
          errmsg = "Unable to send STAT/LSTAT/SETSTAT command";
          goto LAB_00126075;
        }
      }
      else {
        if (sftp->stat_state == libssh2_NB_state_idle) {
          sftp->last_errno = 0;
          s = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
          sftp->stat_packet = s;
          if (s != (uchar *)0x0) {
            _libssh2_store_u32(&s,(iVar3 + iVar7) - 4);
            *s = (uchar)local_4c;
            uVar4 = sftp->request_id;
            sftp->request_id = uVar4 + 1;
            sftp->stat_request_id = uVar4;
            s = s + 1;
            _libssh2_store_u32(&s,uVar4);
            _libssh2_store_str(&s,local_40,local_48);
            if (stat_type == 2) {
              sVar5 = sftp_attr2bin(s,local_60);
              s = s + sVar5;
            }
            sftp->stat_state = libssh2_NB_state_created;
            iVar7 = local_50;
            goto LAB_00125efa;
          }
          iVar3 = -6;
          errmsg = "Unable to allocate memory for FXP_*STAT packet";
          s = (uchar *)0x0;
        }
        else {
LAB_00125f41:
          iVar3 = sftp_packet_requirev
                            (sftp,0x130a84,(uchar *)(ulong)sftp->stat_request_id,(uint32_t)&local_70
                             ,(uchar **)&data_len,(size_t *)0x9,in_stack_ffffffffffffff88);
          if (iVar3 == 0) {
            sftp->stat_state = libssh2_NB_state_idle;
            if (*local_70 == 'e') {
              uVar4 = _libssh2_ntohu32((uchar *)(local_70 + 5));
              (*pLVar1->free)(local_70,&pLVar1->abstract);
              if (uVar4 == 0) {
                local_60->permissions = 0;
                local_60->atime = 0;
                local_60->uid = 0;
                local_60->gid = 0;
                local_60->flags = 0;
                local_60->filesize = 0;
                local_60->mtime = 0;
                return 0;
              }
              sftp->last_errno = uVar4;
              iVar3 = -0x1f;
              errmsg = "SFTP Protocol Error";
            }
            else {
              local_60->permissions = 0;
              local_60->atime = 0;
              local_60->uid = 0;
              local_60->gid = 0;
              local_60->mtime = 0;
              local_60->flags = 0;
              local_60->filesize = 0;
              sVar5 = sftp_bin2attr(local_60,(uchar *)(local_70 + 5),data_len - 5);
              (*pLVar1->free)(local_70,&pLVar1->abstract);
              if (-1 < sVar5) {
                return 0;
              }
              iVar3 = -0x1f;
              errmsg = "Attributes too short in SFTP fstat";
            }
          }
          else {
            if (iVar3 == -0x25) goto LAB_0012607f;
            if (iVar3 == -0x26) {
              if (data_len != 0) {
                (*pLVar1->free)(local_70,&pLVar1->abstract);
              }
              iVar3 = -0x1f;
              errmsg = "SFTP stat packet too short";
            }
            else {
              sftp->stat_state = libssh2_NB_state_idle;
              errmsg = "Timeout waiting for status message";
            }
          }
        }
LAB_00126075:
        iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
LAB_0012607f:
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_stat_ex(LIBSSH2_SFTP *sftp, const char *path,
                     unsigned int path_len, int stat_type,
                     LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_stat(sftp, path, path_len, stat_type, attrs));
    return rc;
}